

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint-hash.c
# Opt level: O0

void uint_hash_clear(uint_hash *h)

{
  uint_hash_entry *he_00;
  uint_hash_entry **he_anchor_00;
  ulong local_28;
  size_t i;
  uint_hash_entry **he_anchor;
  uint_hash_entry *he;
  uint_hash *h_local;
  
  if ((h != (uint_hash *)0x0) && (h->table != (uint_hash_entry **)0x0)) {
    for (local_28 = 0; local_28 < h->slots; local_28 = local_28 + 1) {
      he_anchor_00 = h->table + local_28;
      while (*he_anchor_00 != (uint_hash_entry *)0x0) {
        he_00 = *he_anchor_00;
        uint_hash_entry_unlink(h,he_anchor_00,he_00);
        uint_hash_entry_destroy(h,he_00);
      }
    }
  }
  return;
}

Assistant:

static void uint_hash_clear(struct uint_hash *h)
{
  if(h && h->table) {
    struct uint_hash_entry *he, **he_anchor;
    size_t i;
    DEBUGASSERT(h->init == CURL_UINTHASHINIT);
    for(i = 0; i < h->slots; ++i) {
      he_anchor = &h->table[i];
      while(*he_anchor) {
        he = *he_anchor;
        uint_hash_entry_unlink(h, he_anchor, he);
        uint_hash_entry_destroy(h, he);
      }
    }
  }
}